

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O2

void __thiscall
GenericExceptionCatcher_Tests::generic_catcher_with_custom_action_which_return_fail_code::
test_method(generic_catcher_with_custom_action_which_return_fail_code *this)

{
  int DEFAULT_RETURN_VALUE;
  int EXPECTED_RETURN_VALUE;
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:151:69)>
  allCatcher;
  
  allCatcher._0_8_ = allCatcher._0_8_ & 0xffffffff00000000;
  EXPECTED_RETURN_VALUE = 1;
  allCatcher.supressExceptionsInAction_ = true;
  allCatcher.customAction_.EXPECTED_RETURN_VALUE = &EXPECTED_RETURN_VALUE;
  throw_int(0);
  allCatcher._0_7_ = 0x1000000000000;
  throw_int(0);
  EXPECTED_RETURN_VALUE = 1;
  allCatcher._0_8_ = allCatcher._0_8_ & 0xffffffff00000000;
  allCatcher.supressExceptionsInAction_ = true;
  allCatcher.customAction_.EXPECTED_RETURN_VALUE = &EXPECTED_RETURN_VALUE;
  throw_int(0);
  allCatcher._0_7_ = 0x1000000000000;
  throw_int(0);
  allCatcher.failCode_ = -0x66666666;
  allCatcher._4_4_ = 0x3fb99999;
  allCatcher.customAction_.EXPECTED_RETURN_VALUE._0_3_ = 0x10000;
  throw_int(0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_with_custom_action_which_return_fail_code)
{
   int DEFAULT_RETURN_VALUE  = 0;
   {
      int EXPECTED_RETURN_VALUE = 1;
      auto allCatcher = generic_handler<void>(DEFAULT_RETURN_VALUE, [&](){ return EXPECTED_RETURN_VALUE; });
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(EXPECTED_RETURN_VALUE, allCatcher.handleException());
         }
      }
   }
   {
      auto allCatcher = generic_handler<void>(DEFAULT_RETURN_VALUE, [&](){ return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(DEFAULT_RETURN_VALUE, allCatcher.handleException());
         }
      }
   }
   {
      int EXPECTED_RETURN_VALUE = 1;
      auto intCatcher = generic_handler<int>(DEFAULT_RETURN_VALUE, [&](int&){ return EXPECTED_RETURN_VALUE; });
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(EXPECTED_RETURN_VALUE, intCatcher.handleException());
         }
      }
   }
   {
      auto intCatcher = generic_handler<int>(DEFAULT_RETURN_VALUE, [&](int&){ return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(DEFAULT_RETURN_VALUE, intCatcher.handleException());
         }
      }
   }
   {
      auto intCatcher = generic_handler<int>(0.1, [&](int&) { return 2.5; }); // labda retunrs a double != int, so default value should return
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(2.5, intCatcher.handleException());
         }
      }
   }
}